

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O1

Room * __thiscall Maze::RoomNo(Maze *this,int n)

{
  int iVar1;
  pointer ppRVar2;
  
  ppRVar2 = (this->mRoomVec->super__Vector_base<Room_*,_std::allocator<Room_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar2 !=
      (this->mRoomVec->super__Vector_base<Room_*,_std::allocator<Room_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar1 = Room::GetRoomNumber(*ppRVar2);
      if (iVar1 == n) {
        return *ppRVar2;
      }
      ppRVar2 = ppRVar2 + 1;
    } while (ppRVar2 !=
             (this->mRoomVec->super__Vector_base<Room_*,_std::allocator<Room_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return (Room *)0x0;
}

Assistant:

Room* Maze::RoomNo(int n) const  
{  
    std::vector<Room*>::const_iterator it = mRoomVec->begin();  
    for ( ; it != mRoomVec->end(); ++it)  
    {  
        if ( (*it)->GetRoomNumber() == n )
        {  
            return (*it);  
            break;  
        }  
    }  
    return 0;  
}